

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderTextWrapped(ImVec2 pos,char *text,char *text_end,float wrap_width)

{
  float font_size;
  ImDrawList *this;
  ImFont *font;
  ImGuiContext *pIVar1;
  ImU32 col;
  ImGuiWindow *pIVar2;
  size_t sVar3;
  int text_len;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *pcStack_20;
  float wrap_width_local;
  char *text_end_local;
  char *text_local;
  ImVec2 pos_local;
  
  pIVar1 = GImGui;
  text_local = (char *)pos;
  pIVar2 = GetCurrentWindow();
  pcStack_20 = text_end;
  if (text_end == (char *)0x0) {
    sVar3 = strlen(text);
    pcStack_20 = text + sVar3;
  }
  if (0 < (int)pcStack_20 - (int)text) {
    this = pIVar2->DrawList;
    font = pIVar1->Font;
    font_size = pIVar1->FontSize;
    col = GetColorU32(0,1.0);
    ImDrawList::AddText(this,font,font_size,(ImVec2 *)&text_local,col,text,pcStack_20,wrap_width,
                        (ImVec4 *)0x0);
    if ((pIVar1->LogEnabled & 1U) != 0) {
      LogRenderedText((ImVec2 *)&text_local,text,pcStack_20);
    }
  }
  return;
}

Assistant:

void ImGui::RenderTextWrapped(ImVec2 pos, const char* text, const char* text_end, float wrap_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    if (!text_end)
        text_end = text + strlen(text); // FIXME-OPT

    const int text_len = (int)(text_end - text);
    if (text_len > 0)
    {
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_end, wrap_width);
        if (g.LogEnabled)
            LogRenderedText(pos, text, text_end);
    }
}